

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyser.cpp
# Opt level: O3

void __thiscall SemanticAnalyser::addBuildInSymbols(SemanticAnalyser *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Head_base<0UL,_Symbol_*,_false> _Var2;
  _Head_base<0UL,_Symbol_*,_false> _Var3;
  _List_node_base *p_Var4;
  _Head_base<0UL,_Symbol_*,_false> local_50;
  _Head_base<0UL,_Symbol_*,_false> local_48;
  _Head_base<0UL,_Symbol_*,_false> local_40;
  _Head_base<0UL,_Symbol_*,_false> local_38;
  string local_30;
  
  local_30._M_dataplus._M_p = local_30._M_dataplus._M_p & 0xffffffff00000000;
  std::make_unique<FunctionSymbol,char_const(&)[3],TypeName>
            ((char (*) [3])&local_50,(TypeName *)"if");
  _Var2._M_head_impl = local_50._M_head_impl;
  p_Var4 = (_List_node_base *)operator_new(0x18);
  *(undefined4 *)&p_Var4[1]._M_next = 0;
  std::__detail::_List_node_base::_M_hook(p_Var4);
  _Var3._M_head_impl = local_50._M_head_impl;
  _Var2._M_head_impl[8]._vptr_Symbol = (_func_int **)((long)_Var2._M_head_impl[8]._vptr_Symbol + 1);
  p_Var4 = (_List_node_base *)operator_new(0x18);
  *(undefined4 *)&p_Var4[1]._M_next = 0;
  std::__detail::_List_node_base::_M_hook(p_Var4);
  _Var2._M_head_impl = local_50._M_head_impl;
  _Var3._M_head_impl[8]._vptr_Symbol = (_func_int **)((long)_Var3._M_head_impl[8]._vptr_Symbol + 1);
  p_Var4 = (_List_node_base *)operator_new(0x18);
  *(undefined4 *)&p_Var4[1]._M_next = 0;
  std::__detail::_List_node_base::_M_hook(p_Var4);
  _Var2._M_head_impl[8]._vptr_Symbol = (_func_int **)((long)_Var2._M_head_impl[8]._vptr_Symbol + 1);
  local_30._M_dataplus._M_p._0_4_ = 2;
  std::make_unique<FunctionSymbol,char_const(&)[6],TypeName>
            ((char (*) [6])&local_48,(TypeName *)"print");
  _Var2._M_head_impl = local_48._M_head_impl;
  p_Var4 = (_List_node_base *)operator_new(0x18);
  *(undefined4 *)&p_Var4[1]._M_next = 3;
  std::__detail::_List_node_base::_M_hook(p_Var4);
  _Var2._M_head_impl[8]._vptr_Symbol = (_func_int **)((long)_Var2._M_head_impl[8]._vptr_Symbol + 1);
  paVar1 = &local_30.field_2;
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"if","");
  local_38._M_head_impl = local_50._M_head_impl;
  local_50._M_head_impl = (Symbol *)0x0;
  SymbolTable::addSymbol
            (&this->symbols_,&local_30,(unique_ptr<Symbol,_std::default_delete<Symbol>_> *)&local_38
            );
  if (local_38._M_head_impl != (Symbol *)0x0) {
    (*(local_38._M_head_impl)->_vptr_Symbol[1])();
  }
  local_38._M_head_impl = (Symbol *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"print","");
  local_40._M_head_impl = local_48._M_head_impl;
  local_48._M_head_impl = (Symbol *)0x0;
  SymbolTable::addSymbol
            (&this->symbols_,&local_30,(unique_ptr<Symbol,_std::default_delete<Symbol>_> *)&local_40
            );
  if (local_40._M_head_impl != (Symbol *)0x0) {
    (*(local_40._M_head_impl)->_vptr_Symbol[1])();
  }
  local_40._M_head_impl = (Symbol *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  if (local_48._M_head_impl != (Symbol *)0x0) {
    (*(local_48._M_head_impl)->_vptr_Symbol[1])();
  }
  if (local_50._M_head_impl != (Symbol *)0x0) {
    (*(local_50._M_head_impl)->_vptr_Symbol[1])();
  }
  return;
}

Assistant:

void SemanticAnalyser::addBuildInSymbols()
{
  auto ifSymbol = std::make_unique<FunctionSymbol>("if", TypeName::F32);
  ifSymbol->addArgument(TypeName::F32);
  ifSymbol->addArgument(TypeName::F32);
  ifSymbol->addArgument(TypeName::F32);

  auto printSymbol = std::make_unique<FunctionSymbol>("print", TypeName::Void);
  printSymbol->addArgument(TypeName::String);

  symbols_.addSymbol("if", std::move(ifSymbol));
  symbols_.addSymbol("print", std::move(printSymbol));
}